

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_frame_codec.c
# Opt level: O2

int sasl_frame_codec_encode_frame
              (SASL_FRAME_CODEC_HANDLE sasl_frame_codec,AMQP_VALUE sasl_frame_value,
              ON_BYTES_ENCODED on_bytes_encoded,void *callback_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  AMQP_VALUE value;
  uchar *__ptr;
  int iVar3;
  char *pcVar4;
  size_t encoded_size;
  uint64_t sasl_frame_descriptor_ulong;
  PAYLOAD payload;
  
  if (sasl_frame_codec == (SASL_FRAME_CODEC_HANDLE)0x0 || sasl_frame_value == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xf8;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xf8;
    }
    pcVar4 = "Bad arguments: sasl_frame_codec = %p, sasl_frame_value = %p";
    iVar3 = 0xf7;
LAB_0012bd87:
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
              ,"sasl_frame_codec_encode_frame",iVar3,1,pcVar4,sasl_frame_codec);
    return iVar1;
  }
  value = amqpvalue_get_inplace_descriptor(sasl_frame_value);
  if (value == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x104;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x104;
    }
    pcVar4 = "Cannot get SASL frame descriptor AMQP value";
    iVar3 = 0x103;
LAB_0012beae:
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
              ,"sasl_frame_codec_encode_frame",iVar3,1,pcVar4);
    return iVar1;
  }
  iVar1 = amqpvalue_get_ulong(value,&sasl_frame_descriptor_ulong);
  if (iVar1 != 0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x10a;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x10a;
    }
    pcVar4 = "Cannot get SASL frame descriptor ulong";
    iVar3 = 0x109;
    goto LAB_0012beae;
  }
  if (sasl_frame_descriptor_ulong - 0x45 < 0xfffffffffffffffb) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x112;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x112;
    }
    pcVar4 = "Bad SASL frame descriptor";
    iVar3 = 0x111;
    goto LAB_0012beae;
  }
  iVar1 = amqpvalue_get_encoded_size(sasl_frame_value,&encoded_size);
  if (iVar1 != 0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x11a;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x11a;
    }
    pcVar4 = "Cannot get SASL frame encoded size";
    iVar3 = 0x119;
    goto LAB_0012beae;
  }
  if (CONCAT44(encoded_size._4_4_,(uint)encoded_size) - 0x1f9 < 0xfffffffffffffe08) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x122;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x122;
    }
    sasl_frame_codec = (SASL_FRAME_CODEC_HANDLE)(ulong)(uint)encoded_size;
    pcVar4 = "SASL frame encoded size out of bounds (%u)";
    iVar3 = 0x121;
    goto LAB_0012bd87;
  }
  __ptr = (uchar *)malloc(CONCAT44(encoded_size._4_4_,(uint)encoded_size));
  if (__ptr == (uchar *)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x12a;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x12a;
    }
    pcVar4 = "Cannot allocate SASL frame bytes";
    iVar3 = 0x129;
    goto LAB_0012beae;
  }
  payload.length = 0;
  payload.bytes = __ptr;
  iVar1 = amqpvalue_encode(sasl_frame_value,encode_bytes,&payload);
  if (iVar1 == 0) {
    iVar3 = 0;
    iVar1 = frame_codec_encode_frame
                      (sasl_frame_codec->frame_codec,'\x01',&payload,1,(uchar *)0x0,0,
                       on_bytes_encoded,callback_context);
    if (iVar1 == 0) goto LAB_0012c01c;
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0x143;
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0012c01c;
    pcVar4 = "Cannot encode SASL frame";
    iVar1 = 0x142;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0x136;
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0012c01c;
    pcVar4 = "Cannot encode SASL frame value";
    iVar1 = 0x135;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
            ,"sasl_frame_codec_encode_frame",iVar1,1,pcVar4);
LAB_0012c01c:
  free(__ptr);
  return iVar3;
}

Assistant:

int sasl_frame_codec_encode_frame(SASL_FRAME_CODEC_HANDLE sasl_frame_codec, AMQP_VALUE sasl_frame_value, ON_BYTES_ENCODED on_bytes_encoded, void* callback_context)
{
    int result;
    SASL_FRAME_CODEC_INSTANCE* sasl_frame_codec_instance = (SASL_FRAME_CODEC_INSTANCE*)sasl_frame_codec;

    /* Codes_SRS_SASL_FRAME_CODEC_01_030: [If sasl_frame_codec or sasl_frame_value is NULL, sasl_frame_codec_encode_frame shall fail and return a non-zero value.] */
    if ((sasl_frame_codec == NULL) ||
        (sasl_frame_value == NULL))
    {
        /* Codes_SRS_SASL_FRAME_CODEC_01_034: [If any error occurs during encoding, sasl_frame_codec_encode_frame shall fail and return a non-zero value.] */
        LogError("Bad arguments: sasl_frame_codec = %p, sasl_frame_value = %p",
            sasl_frame_codec, sasl_frame_value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE descriptor;
        uint64_t sasl_frame_descriptor_ulong;
        size_t encoded_size;

        if ((descriptor = amqpvalue_get_inplace_descriptor(sasl_frame_value)) == NULL)
        {
            /* Codes_SRS_SASL_FRAME_CODEC_01_034: [If any error occurs during encoding, sasl_frame_codec_encode_frame shall fail and return a non-zero value.] */
            LogError("Cannot get SASL frame descriptor AMQP value");
            result = MU_FAILURE;
        }
        else if (amqpvalue_get_ulong(descriptor, &sasl_frame_descriptor_ulong) != 0)
        {
            /* Codes_SRS_SASL_FRAME_CODEC_01_034: [If any error occurs during encoding, sasl_frame_codec_encode_frame shall fail and return a non-zero value.] */
            LogError("Cannot get SASL frame descriptor ulong");
            result = MU_FAILURE;
        }
        /* Codes_SRS_SASL_FRAME_CODEC_01_047: [The frame body of a SASL frame MUST contain exactly one AMQP type, whose type encoding MUST have provides="sasl-frame".] */
        else if ((sasl_frame_descriptor_ulong < SASL_MECHANISMS) ||
            (sasl_frame_descriptor_ulong > SASL_OUTCOME))
        {
            /* Codes_SRS_SASL_FRAME_CODEC_01_034: [If any error occurs during encoding, sasl_frame_codec_encode_frame shall fail and return a non-zero value.] */
            LogError("Bad SASL frame descriptor");
            result = MU_FAILURE;
        }
        /* Codes_SRS_SASL_FRAME_CODEC_01_032: [The payload frame size shall be computed based on the encoded size of the sasl_frame_value and its fields.] */
        /* Codes_SRS_SASL_FRAME_CODEC_01_033: [The encoded size of the sasl_frame_value and its fields shall be obtained by calling amqpvalue_get_encoded_size.] */
        else if (amqpvalue_get_encoded_size(sasl_frame_value, &encoded_size) != 0)
        {
            /* Codes_SRS_SASL_FRAME_CODEC_01_034: [If any error occurs during encoding, sasl_frame_codec_encode_frame shall fail and return a non-zero value.] */
            LogError("Cannot get SASL frame encoded size");
            result = MU_FAILURE;
        }
        /* Codes_SRS_SASL_FRAME_CODEC_01_016: [The maximum size of a SASL frame is defined by MIN-MAX-FRAME-SIZE.] */
        /* Codes_SRS_SASL_FRAME_CODEC_01_017: [The minimum size of a SASL frame is defined by MIN_FRAME_SIZE (1 byte).] */
        else if (encoded_size < MIN_FRAME_SIZE || encoded_size > (MIX_MAX_FRAME_SIZE - 8))
        {
            /* Codes_SRS_SASL_FRAME_CODEC_01_034: [If any error occurs during encoding, sasl_frame_codec_encode_frame shall fail and return a non-zero value.] */
            LogError("SASL frame encoded size out of bounds (%u)", (unsigned int)encoded_size);
            result = MU_FAILURE;
        }
        else
        {
            unsigned char* sasl_frame_bytes = (unsigned char*)malloc(encoded_size);
            if (sasl_frame_bytes == NULL)
            {
                LogError("Cannot allocate SASL frame bytes");
                result = MU_FAILURE;
            }
            else
            {
                PAYLOAD payload;

                payload.bytes = sasl_frame_bytes;
                payload.length = 0;

                if (amqpvalue_encode(sasl_frame_value, encode_bytes, &payload) != 0)
                {
                    LogError("Cannot encode SASL frame value");
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_SRS_SASL_FRAME_CODEC_01_031: [sasl_frame_codec_encode_frame shall encode the frame header and its contents by using frame_codec_encode_frame.] */
                    /* Codes_SRS_SASL_FRAME_CODEC_01_012: [Bytes 6 and 7 of the header are ignored.] */
                    /* Codes_SRS_SASL_FRAME_CODEC_01_013: [Implementations SHOULD set these to 0x00.] */
                    /* Codes_SRS_SASL_FRAME_CODEC_01_014: [The extended header is ignored.] */
                    /* Codes_SRS_SASL_FRAME_CODEC_01_015: [Implementations SHOULD therefore set DOFF to 0x02.] */
                    if (frame_codec_encode_frame(sasl_frame_codec_instance->frame_codec, FRAME_TYPE_SASL, &payload, 1, NULL, 0, on_bytes_encoded, callback_context) != 0)
                    {
                        /* Codes_SRS_SASL_FRAME_CODEC_01_034: [If any error occurs during encoding, sasl_frame_codec_encode_frame shall fail and return a non-zero value.] */
                        LogError("Cannot encode SASL frame");
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }

                free(sasl_frame_bytes);
            }
        }
    }

    return result;
}